

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O0

void print<ft::map<int,int,ft::greater<int>,ft::allocator<ft::pair<int_const,int>>>>
               (map<int,_int,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *t,
               char *s)

{
  bool bVar1;
  ostream *poVar2;
  const_pointer pvVar3;
  treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  local_78;
  const_iterator local_60;
  int local_34;
  undefined1 local_30 [8];
  const_iterator it;
  char *s_local;
  map<int,_int,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *t_local;
  
  it.
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  .m_node = (treeNode<ft::pair<const_int,_int>_> *)s;
  ft::
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ::constTreeIterator((constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                       *)local_30);
  local_34 = (int)std::setw(3);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)local_34);
  poVar2 = std::operator<<(poVar2,(char *)it.
                                          super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                                          .m_node);
  std::operator<<(poVar2," contains:");
  ft::
  treeBase<int,_int,_ft::pair<const_int,_int>,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ::begin(&local_60,
          (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           *)t);
  ft::
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ::operator=((constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
               *)local_30,&local_60);
  ft::
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ::~constTreeIterator(&local_60);
  while( true ) {
    ft::
    treeBase<int,_int,_ft::pair<const_int,_int>,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
    ::end((const_iterator *)&local_78,
          (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           *)t);
    bVar1 = ft::operator!=((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                            *)local_30,&local_78);
    ft::
    constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::~constTreeIterator
              ((constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                *)&local_78);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout," (");
    pvVar3 = ft::
             constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
             ::operator->((constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                           *)local_30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3->first);
    poVar2 = std::operator<<(poVar2," => ");
    pvVar3 = ft::
             constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
             ::operator->((constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                           *)local_30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3->second);
    std::operator<<(poVar2,')');
    ft::
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::operator++((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                  *)local_30);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  ft::
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ::~constTreeIterator
            ((constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
              *)local_30);
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << " (" << it->first << " => " << it->second << ')';
	std::cout << std::endl;
}